

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall spirv_cross::Compiler::add_active_interface_variable(Compiler *this,uint32_t var_id)

{
  uint32_t uVar1;
  SPIREntryPoint *pSVar2;
  TypedID<(spirv_cross::Types)2> *pTVar3;
  TypedID<(spirv_cross::Types)2> local_1c;
  uint32_t local_18;
  value_type local_14;
  
  local_14.id = var_id;
  ::std::__detail::
  _Insert<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
  ::insert((_Insert<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
            *)&this->active_interface_variables,&local_14);
  uVar1 = ParsedIR::get_spirv_version(&this->ir);
  if (0x103ff < uVar1) {
    pSVar2 = get_entry_point(this);
    pTVar3 = (pSVar2->interface_variables).
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
    local_18 = var_id;
    pTVar3 = ::std::
             __find_if<spirv_cross::TypedID<(spirv_cross::Types)2>*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)2>const>>
                       (pTVar3,pTVar3 + (pSVar2->interface_variables).
                                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
                                        .buffer_size);
    if (pTVar3 == (pSVar2->interface_variables).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr +
                  (pSVar2->interface_variables).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size) {
      local_1c.id = var_id;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::push_back
                (&pSVar2->interface_variables,&local_1c);
    }
  }
  return;
}

Assistant:

void Compiler::add_active_interface_variable(uint32_t var_id)
{
	active_interface_variables.insert(var_id);

	// In SPIR-V 1.4 and up we must also track the interface variable in the entry point.
	if (ir.get_spirv_version() >= 0x10400)
	{
		auto &vars = get_entry_point().interface_variables;
		if (find(begin(vars), end(vars), VariableID(var_id)) == end(vars))
			vars.push_back(var_id);
	}
}